

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilterindex.cpp
# Opt level: O1

bool __thiscall BlockFilterIndex::CustomAppend(BlockFilterIndex *this,BlockInfo *block)

{
  BlockFilterType filter_type;
  bool bVar1;
  CBlockIndex *index;
  CBlock **ppCVar2;
  long in_FS_OFFSET;
  CBlockUndo block_undo;
  BlockFilter filter;
  vector<CTxUndo,_std::allocator<CTxUndo>_> local_c8;
  uint256 local_b0;
  RecursiveMutex *local_90;
  uchar local_88;
  pointer local_40;
  pointer local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_c8.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_c8.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_c8.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (0 < block->height) {
    local_90 = &cs_main;
    local_88 = false;
    std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&local_90);
    index = ::node::BlockManager::LookupBlockIndex
                      (((this->super_BaseIndex).m_chainstate)->m_blockman,block->hash);
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)&local_90);
    bVar1 = ::node::BlockManager::UndoReadFromDisk
                      (((this->super_BaseIndex).m_chainstate)->m_blockman,(CBlockUndo *)&local_c8,
                       index);
    if (!bVar1) {
      bVar1 = false;
      goto LAB_00899041;
    }
  }
  filter_type = this->m_filter_type;
  ppCVar2 = inline_assertion_check<true,CBlock_const*const&>
                      (&block->data,
                       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/index/blockfilterindex.cpp"
                       ,0x108,"CustomAppend","block.data");
  BlockFilter::BlockFilter((BlockFilter *)&local_90,filter_type,*ppCVar2,(CBlockUndo *)&local_c8);
  BlockFilter::ComputeHeader(&local_b0,(BlockFilter *)&local_90,&this->m_last_header);
  bVar1 = Write(this,(BlockFilter *)&local_90,block->height,&local_b0);
  if (bVar1) {
    *(undefined8 *)((this->m_last_header).super_base_blob<256U>.m_data._M_elems + 0x10) =
         local_b0.super_base_blob<256U>.m_data._M_elems._16_8_;
    *(undefined8 *)((this->m_last_header).super_base_blob<256U>.m_data._M_elems + 0x18) =
         local_b0.super_base_blob<256U>.m_data._M_elems._24_8_;
    *(undefined8 *)(this->m_last_header).super_base_blob<256U>.m_data._M_elems =
         local_b0.super_base_blob<256U>.m_data._M_elems._0_8_;
    *(undefined8 *)((this->m_last_header).super_base_blob<256U>.m_data._M_elems + 8) =
         local_b0.super_base_blob<256U>.m_data._M_elems._8_8_;
  }
  if (local_40 != (pointer)0x0) {
    operator_delete(local_40,(long)local_30 - (long)local_40);
  }
LAB_00899041:
  std::vector<CTxUndo,_std::allocator<CTxUndo>_>::~vector(&local_c8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool BlockFilterIndex::CustomAppend(const interfaces::BlockInfo& block)
{
    CBlockUndo block_undo;

    if (block.height > 0) {
        // pindex variable gives indexing code access to node internals. It
        // will be removed in upcoming commit
        const CBlockIndex* pindex = WITH_LOCK(cs_main, return m_chainstate->m_blockman.LookupBlockIndex(block.hash));
        if (!m_chainstate->m_blockman.UndoReadFromDisk(block_undo, *pindex)) {
            return false;
        }
    }

    BlockFilter filter(m_filter_type, *Assert(block.data), block_undo);

    const uint256& header = filter.ComputeHeader(m_last_header);
    bool res = Write(filter, block.height, header);
    if (res) m_last_header = header; // update last header
    return res;
}